

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-ring.c
# Opt level: O3

size_t lws_ring_get_count_waiting_elements(lws_ring *ring,uint32_t *tail)

{
  ulong uVar1;
  uint uVar2;
  uint32_t *puVar3;
  
  puVar3 = &ring->oldest_tail;
  if (tail != (uint32_t *)0x0) {
    puVar3 = tail;
  }
  uVar1 = 0;
  uVar2 = ring->head - *puVar3;
  if (uVar2 != 0) {
    if (ring->head < *puVar3 || uVar2 == 0) {
      uVar2 = uVar2 + ring->buflen;
    }
    uVar1 = (ulong)uVar2;
  }
  return uVar1 / ring->element_len;
}

Assistant:

size_t
lws_ring_get_count_waiting_elements(struct lws_ring *ring, uint32_t *tail)
{	int f;

	if (!tail)
		tail = &ring->oldest_tail;
	/*
	 * possible ringbuf patterns
	 *
	 * h == t
	 * |--------t***h---|
	 * |**h-----------t*|
	 * |t**************h|
	 * |*****ht*********|
	 */
	if (ring->head == *tail)
		f = 0;
	else
		if (ring->head > *tail)
			f = (int)(ring->head - *tail);
		else
			f = (int)((ring->buflen - *tail) + ring->head);

	return (unsigned int)f / ring->element_len;
}